

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsst.cpp
# Opt level: O2

void duckdb::FSSTStorage::Select
               (ColumnSegment *segment,ColumnScanState *state,idx_t vector_count,Vector *result,
               SelectionVector *sel,idx_t sel_count)

{
  BufferHandle *this;
  idx_t iVar1;
  FSSTScanState *scan_state;
  data_ptr_t pdVar2;
  StringDictionaryContainer dict;
  VectorStringBuffer *str_buffer;
  idx_t index;
  idx_t iVar3;
  idx_t start;
  data_ptr_t pdVar4;
  string_t sVar5;
  bp_delta_offsets_t offsets;
  bp_delta_offsets_t local_68;
  
  scan_state = (FSSTScanState *)
               unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
               ::operator->(&state->scan_state);
  start = state->row_index - (segment->super_SegmentBase<duckdb::ColumnSegment>).start;
  this = &(scan_state->super_StringScanState).handle;
  pdVar2 = BufferHandle::Ptr(this);
  iVar1 = segment->offset;
  dict = GetDictionary(segment,this);
  str_buffer = StringVector::GetStringBuffer(result);
  StartScan(&local_68,scan_state,pdVar2 + iVar1 + 0x10,start,vector_count);
  pdVar4 = result->data + 8;
  for (iVar3 = 0; sel_count != iVar3; iVar3 = iVar3 + 1) {
    index = iVar3;
    if (sel->sel_vector != (sel_t *)0x0) {
      index = (idx_t)sel->sel_vector[iVar3];
    }
    sVar5 = FSSTScanState::DecompressString
                      (scan_state,dict,pdVar2 + iVar1,&local_68,index,str_buffer);
    *(long *)(pdVar4 + -8) = sVar5.value._0_8_;
    *(long *)pdVar4 = sVar5.value._8_8_;
    pdVar4 = pdVar4 + 0x10;
  }
  scan_state->last_known_index =
       (scan_state->delta_decode_buffer).
       super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
       super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
       super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl
       [local_68.unused_delta_decoded_values + vector_count + 0xffffffffffffffff];
  scan_state->last_known_row = vector_count + start + -1;
  return;
}

Assistant:

void FSSTStorage::Select(ColumnSegment &segment, ColumnScanState &state, idx_t vector_count, Vector &result,
                         const SelectionVector &sel, idx_t sel_count) {
	auto &scan_state = state.scan_state->Cast<FSSTScanState>();
	auto start = segment.GetRelativeIndex(state.row_index);

	auto baseptr = scan_state.handle.Ptr() + segment.GetBlockOffset();
	auto dict = GetDictionary(segment, scan_state.handle);
	auto base_data = data_ptr_cast(baseptr + sizeof(fsst_compression_header_t));

	D_ASSERT(result.GetVectorType() == VectorType::FLAT_VECTOR);

	auto &str_buffer = StringVector::GetStringBuffer(result);
	auto offsets = StartScan(scan_state, base_data, start, vector_count);
	auto result_data = FlatVector::GetData<string_t>(result);

	for (idx_t i = 0; i < sel_count; i++) {
		idx_t index = sel.get_index(i);
		result_data[i] = scan_state.DecompressString(dict, baseptr, offsets, index, str_buffer);
	}
	EndScan(scan_state, offsets, start, vector_count);
}